

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall
nv::FloatImage::applyKernelVertical(FloatImage *this,Kernel1 *k,int x,int y,uint c,WrapMode wm)

{
  uint uVar1;
  float *pfVar2;
  char *pcVar3;
  float fVar4;
  int idx;
  int src_y;
  uint i;
  float sum;
  float *channel;
  int kernelOffset;
  uint kernelWindow;
  WrapMode wm_local;
  uint c_local;
  int y_local;
  int x_local;
  Kernel1 *k_local;
  FloatImage *this_local;
  
  uVar1 = Kernel1::windowSize(k);
  pfVar2 = FloatImage::channel(this,c);
  src_y = 0;
  for (idx = 0; (uint)idx < uVar1; idx = idx + 1) {
    pcVar3 = index(this,(char *)(ulong)(uint)x,(y + idx) - ((uVar1 >> 1) - 1));
    fVar4 = Kernel1::valueAt(k,idx);
    src_y = (int)(fVar4 * pfVar2[(int)pcVar3] + (float)src_y);
  }
  return (float)src_y;
}

Assistant:

float FloatImage::applyKernelVertical(const Kernel1 * k, int x, int y, uint c, WrapMode wm) const
{
	nvDebugCheck(k != NULL);
	
	const uint kernelWindow = k->windowSize();
	const int kernelOffset = int(kernelWindow / 2) - 1;
	
	const float * channel = this->channel(c);

	float sum = 0.0f;
	for (uint i = 0; i < kernelWindow; i++)
	{
		const int src_y = int(y + i) - kernelOffset;
		const int idx = this->index(x, src_y, wm);
		
		sum += k->valueAt(i) * channel[idx];
	}
	
	return sum;
}